

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O2

int externalSubset1(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  int iVar1;
  code *pcVar2;
  
  if (tok == -4) {
    if (state->includeLevel == 0) {
      return 0;
    }
LAB_0047bd1e:
    state->handler = error;
    return -1;
  }
  if (tok == 0xf) {
    return 0;
  }
  if (tok == 0x1a) goto LAB_0047bd1e;
  if (tok == 0x22) {
    if (state->includeLevel != 0) {
      state->includeLevel = state->includeLevel - 1;
      return 0;
    }
    goto LAB_0047bd1e;
  }
  if (tok == 0x21) {
    state->handler = condSect0;
    return 0;
  }
  iVar1 = 0;
  switch(tok) {
  case 0xb:
  case 0xd:
  case 0xf:
    break;
  case 0x10:
    iVar1 = (*enc->nameMatchesAscii)(enc,ptr + (long)enc->minBytesPerChar * 2,end,"ENTITY");
    if (iVar1 == 0) {
      iVar1 = (*enc->nameMatchesAscii)(enc,ptr + (long)enc->minBytesPerChar * 2,end,"ATTLIST");
      if (iVar1 == 0) {
        iVar1 = (*enc->nameMatchesAscii)(enc,ptr + (long)enc->minBytesPerChar * 2,end,"ELEMENT");
        if (iVar1 == 0) {
          iVar1 = (*enc->nameMatchesAscii)(enc,ptr + (long)enc->minBytesPerChar * 2,end,"NOTATION");
          if (iVar1 == 0) goto switchD_0047b7d5_caseD_c;
          pcVar2 = notation0;
        }
        else {
          pcVar2 = element0;
        }
      }
      else {
        pcVar2 = attlist0;
      }
    }
    else {
      pcVar2 = entity0;
    }
LAB_0047b8c0:
    state->handler = pcVar2;
    iVar1 = 0;
    break;
  default:
    if (tok == 0x1a) {
      pcVar2 = doctype5;
      goto LAB_0047b8c0;
    }
    if (tok == 0x1c) {
      return 0x35;
    }
  case 0xc:
  case 0xe:
switchD_0047b7d5_caseD_c:
    if ((tok == 0x1c) && (state->documentEntity == 0)) {
      iVar1 = 0x34;
    }
    else {
      state->handler = error;
      iVar1 = -1;
    }
  }
  return iVar1;
}

Assistant:

static
int externalSubset1(PROLOG_STATE *state,
                    int tok,
                    const char *ptr,
                    const char *end,
                    const ENCODING *enc)
{
  switch (tok) {
  case XML_TOK_COND_SECT_OPEN:
    state->handler = condSect0;
    return XML_ROLE_NONE;
  case XML_TOK_COND_SECT_CLOSE:
    if (state->includeLevel == 0)
      break;
    state->includeLevel -= 1;
    return XML_ROLE_NONE;
  case XML_TOK_PROLOG_S:
    return XML_ROLE_NONE;
  case XML_TOK_CLOSE_BRACKET:
    break;
  case XML_TOK_NONE:
    if (state->includeLevel)
      break;
    return XML_ROLE_NONE;
  default:
    return internalSubset(state, tok, ptr, end, enc);
  }
  return common(state, tok);
}